

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

instruction * dmrC_alloc_phisrc(dmr_C *C,pseudo_t pseudo,symbol *type)

{
  symbol *insn_00;
  pseudo_t ppVar1;
  pseudo_t phi;
  instruction *insn;
  symbol *type_local;
  pseudo_t pseudo_local;
  dmr_C *C_local;
  
  insn_00 = (symbol *)alloc_typed_instruction(C,0x2f,type);
  ppVar1 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
  ppVar1->type = PSEUDO_PHI;
  dmrC_alloc_phisrc::nr = dmrC_alloc_phisrc::nr + 1;
  ppVar1->nr = dmrC_alloc_phisrc::nr;
  (ppVar1->field_5).sym = insn_00;
  dmrC_use_pseudo(C,(instruction *)insn_00,pseudo,
                  (pseudo_t *)
                  &((anon_union_24_12_0e8c74c2_for_instruction_7 *)&insn_00->replace)->field_0);
  ((anon_union_8_2_14638a90_for_instruction_5 *)&insn_00->next_id)->target = ppVar1;
  return (instruction *)insn_00;
}

Assistant:

struct instruction *dmrC_alloc_phisrc(struct dmr_C *C, pseudo_t pseudo, struct symbol *type)
{
	struct instruction *insn = alloc_typed_instruction(C, OP_PHISOURCE, type);
	pseudo_t phi = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator, 0);
	static int nr = 0;

	phi->type = PSEUDO_PHI;
	phi->nr = ++nr;
	phi->def = insn;

	dmrC_use_pseudo(C, insn, pseudo, &insn->phi_src);
	insn->target = phi;
	return insn;
}